

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O3

void __thiscall
rsg::RelationalOp<rsg::ComputeGreaterThanRange,_rsg::EvaluateGreaterThan>::evaluate
          (RelationalOp<rsg::ComputeGreaterThanRange,_rsg::EvaluateGreaterThan> *this,
          ExecValueAccess dst,ExecConstValueAccess a,ExecConstValueAccess b)

{
  float fVar1;
  Type TVar2;
  long lVar3;
  
  TVar2 = (a.m_type)->m_baseType;
  if (TVar2 == TYPE_FLOAT) {
    lVar3 = 0;
    do {
      fVar1 = a.m_value[lVar3].floatVal;
      dst.super_ConstStridedValueAccess<64>.m_value[lVar3].boolVal =
           b.m_value[lVar3].floatVal <= fVar1 && fVar1 != b.m_value[lVar3].floatVal;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
  }
  else if (TVar2 == TYPE_INT) {
    lVar3 = 0;
    do {
      dst.super_ConstStridedValueAccess<64>.m_value[lVar3].boolVal =
           b.m_value[lVar3].intVal < a.m_value[lVar3].intVal;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
  }
  return;
}

Assistant:

void RelationalOp<ComputeValueRange, EvaluateComp>::evaluate (ExecValueAccess dst, ExecConstValueAccess a, ExecConstValueAccess b)
{
	DE_ASSERT(a.getType() == b.getType());
	switch (a.getType().getBaseType())
	{
		case VariableType::TYPE_FLOAT:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
				dst.asBool(compNdx) = EvaluateComp()(a.asFloat(compNdx), b.asFloat(compNdx));
			break;

		case VariableType::TYPE_INT:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
				dst.asBool(compNdx) = EvaluateComp()(a.asInt(compNdx), b.asInt(compNdx));
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}
}